

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

nng_err nni_http_add_header(nng_http *conn,char *key,char *val)

{
  _Bool _Var1;
  int iVar2;
  nng_err nVar3;
  char *in_RAX;
  undefined8 *puVar4;
  char *pcVar5;
  nng_http_res *pnVar6;
  char *local_38;
  nni_list *list;
  
  local_38 = in_RAX;
  _Var1 = http_set_known_header(conn,key,val);
  nVar3 = NNG_OK;
  if (!_Var1) {
    pnVar6 = &conn->res;
    if (conn->client != false) {
      pnVar6 = (nng_http_res *)&conn->req;
    }
    list = &(pnVar6->data).hdrs;
    for (puVar4 = (undefined8 *)nni_list_first(list); puVar4 != (undefined8 *)0x0;
        puVar4 = (undefined8 *)nni_list_next(list,puVar4)) {
      iVar2 = nni_strcasecmp(key,(char *)*puVar4);
      if (iVar2 == 0) {
        nVar3 = nni_asprintf(&local_38,"%s, %s",puVar4[1],val);
        if (nVar3 != NNG_OK) {
          return nVar3;
        }
        if ((*(byte *)(puVar4 + 4) & 2) == 0) {
          nni_strfree((char *)puVar4[1]);
        }
        puVar4[1] = local_38;
        return NNG_OK;
      }
    }
    puVar4 = (undefined8 *)nni_zalloc(0x28);
    nVar3 = NNG_ENOMEM;
    if (puVar4 != (undefined8 *)0x0) {
      *(byte *)(puVar4 + 4) = *(byte *)(puVar4 + 4) | 4;
      pcVar5 = nni_strdup(key);
      *puVar4 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        pcVar5 = nni_strdup(val);
        puVar4[1] = pcVar5;
        if (pcVar5 != (char *)0x0) {
          nni_list_append(list,puVar4);
          return NNG_OK;
        }
        nni_strfree((char *)*puVar4);
      }
      nni_free(puVar4,0x28);
    }
  }
  return nVar3;
}

Assistant:

static nng_err
http_add_header(nng_http *conn, const char *key, const char *val)
{
	nni_http_entity *data =
	    conn->client ? &conn->req.data : &conn->res.data;
	http_header *h;
	NNI_LIST_FOREACH (&data->hdrs, h) {
		if (nni_strcasecmp(key, h->name) == 0) {
			char *news;
			int   rv;
			rv = nni_asprintf(&news, "%s, %s", h->value, val);
			if (rv != NNG_OK) {
				return (rv);
			}
			if (!h->static_value) {
				nni_strfree(h->value);
			}
			h->value = news;
			return (NNG_OK);
		}
	}

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	h->alloc_header = true;
	if ((h->name = nni_strdup(key)) == NULL) {
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	if ((h->value = nni_strdup(val)) == NULL) {
		nni_strfree(h->name);
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	nni_list_append(&data->hdrs, h);
	return (NNG_OK);
}